

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O0

int_type __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::underflow
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char_type *pcVar4;
  long lVar5;
  cmBasicUVStreambuf<char,_std::char_traits<char>_> *this_local;
  
  bVar1 = is_open(this);
  if (bVar1) {
    uVar2 = std::streambuf::gptr();
    uVar3 = std::streambuf::egptr();
    if (uVar2 < uVar3) {
      pcVar4 = (char_type *)std::streambuf::gptr();
      this_local._4_4_ = std::char_traits<char>::to_int_type(pcVar4);
    }
    else {
      StreamReadStartStop(this);
      while( true ) {
        lVar5 = std::streambuf::in_avail();
        if (lVar5 != 0) break;
        uv_run(this->Stream->loop,UV_RUN_ONCE);
      }
      lVar5 = std::streambuf::in_avail();
      if (lVar5 == -1) {
        this_local._4_4_ = std::char_traits<char>::eof();
      }
      else {
        pcVar4 = (char_type *)std::streambuf::gptr();
        this_local._4_4_ = std::char_traits<char>::to_int_type(pcVar4);
      }
    }
  }
  else {
    this_local._4_4_ = std::char_traits<char>::eof();
  }
  return this_local._4_4_;
}

Assistant:

typename cmBasicUVStreambuf<CharT, Traits>::int_type
cmBasicUVStreambuf<CharT, Traits>::underflow()
{
  if (!this->is_open()) {
    return Traits::eof();
  }

  if (this->gptr() < this->egptr()) {
    return Traits::to_int_type(*this->gptr());
  }

  this->StreamReadStartStop();
  while (this->in_avail() == 0) {
    uv_run(this->Stream->loop, UV_RUN_ONCE);
  }
  if (this->in_avail() == -1) {
    return Traits::eof();
  }
  return Traits::to_int_type(*this->gptr());
}